

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSONConfigurePresets.cxx
# Opt level: O0

bool anon_unknown.dwarf_d763fb::VariableValueHelper(string *out,Value *value,cmJSONState *state)

{
  bool bVar1;
  char *pcVar2;
  cmJSONState *state_local;
  Value *value_local;
  string *out_local;
  
  if (value == (Value *)0x0) {
    std::__cxx11::string::clear();
    out_local._7_1_ = true;
  }
  else {
    bVar1 = Json::Value::isBool(value);
    if (bVar1) {
      bVar1 = Json::Value::asBool(value);
      pcVar2 = "FALSE";
      if (bVar1) {
        pcVar2 = "TRUE";
      }
      std::__cxx11::string::operator=((string *)out,pcVar2);
      out_local._7_1_ = true;
    }
    else {
      out_local._7_1_ =
           std::
           function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
           ::operator()((function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
                         *)(anonymous_namespace)::VariableStringHelper_abi_cxx11_,out,value,state);
    }
  }
  return out_local._7_1_;
}

Assistant:

bool VariableValueHelper(std::string& out, const Json::Value* value,
                         cmJSONState* state)
{
  if (!value) {
    out.clear();
    return true;
  }

  if (value->isBool()) {
    out = value->asBool() ? "TRUE" : "FALSE";
    return true;
  }

  return VariableStringHelper(out, value, state);
}